

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lq.c
# Opt level: O3

lqDB * lqCreateDatabase(float originx,float originy,float originz,float sizex,float sizey,
                       float sizez,int divx,int divy,int divz)

{
  lqInternalDB *lq;
  
  lq = (lqInternalDB *)malloc(0x38);
  lqInitDatabase(lq,originx,originy,originz,sizex,sizey,sizez,divx,divy,divz);
  return lq;
}

Assistant:

lqInternalDB* lqCreateDatabase (float originx, float originy, float originz,
				float sizex, float sizey, float sizez,
				int divx, int divy, int divz)
{
    lqInternalDB* lq = ((lqInternalDB*) malloc (sizeof (lqInternalDB)));

    lqInitDatabase (lq,
		    originx, originy, originz,
		    sizex, sizey, sizez,
		    divx, divy, divz);
    return lq;
}